

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  HttpInputStreamImpl *this_00;
  ulong maxBytes_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<unsigned_long> PVar2;
  undefined1 local_50 [24];
  size_t local_38;
  Own<kj::_::PromiseNode> local_30;
  
  maxBytes_00 = *(ulong *)((long)buffer + 0x18);
  if (maxBytes_00 == 0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    pPVar1 = extraout_RDX_00;
  }
  else {
    if (maxBytes < maxBytes_00) {
      maxBytes_00 = maxBytes;
    }
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)local_50,*(void **)((long)buffer + 8),minBytes,maxBytes_00);
    this_00 = (HttpInputStreamImpl *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_50,
               _::
               TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1497:15),_kj::_::PropagateException>
               ::anon_class_16_2_dfc37374_for_func::operator());
    (this_00->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_004281d8;
    (this_00->headerBuffer).disposer = (ArrayDisposer *)buffer;
    this_00->messageHeaderEnd = maxBytes;
    local_50._16_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpFixedLengthEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_30.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpFixedLengthEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_38 = 0;
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpFixedLengthEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    (this->super_HttpEntityBodyReader).inner = this_00;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_30);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_50 + 0x10));
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_50);
    pPVar1 = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (length == 0) return size_t(0);

    return inner.tryRead(buffer, kj::min(minBytes, length), kj::min(maxBytes, length))
        .then([=](size_t amount) {
      length -= amount;
      if (length > 0 && amount < minBytes) {
        kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length"));
      } else if (length == 0) {
        doneReading();
      }
      return amount;
    });
  }